

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# in.c
# Opt level: O3

LY_ERR ly_in_read(ly_in *in,void *buf,size_t count)

{
  char *pcVar1;
  
  if (in == (ly_in *)0x0) {
    pcVar1 = "in";
  }
  else {
    if (buf != (void *)0x0) {
      if ((in->length != 0) && (in->start + (in->length - (long)in->current) < count)) {
        return LY_EDENIED;
      }
      if (count != 0) {
        memcpy(buf,in->current,count);
      }
      in->current = in->current + count;
      return LY_SUCCESS;
    }
    pcVar1 = "buf";
  }
  ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).",pcVar1,"ly_in_read");
  return LY_EINVAL;
}

Assistant:

LIBYANG_API_DEF LY_ERR
ly_in_read(struct ly_in *in, void *buf, size_t count)
{
    LY_CHECK_ARG_RET(NULL, in, buf, LY_EINVAL);

    if (in->length && (in->length - (in->current - in->start) < count)) {
        /* EOF */
        return LY_EDENIED;
    }

    if (count) {
        memcpy(buf, in->current, count);
    }
    in->current += count;
    return LY_SUCCESS;
}